

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

format_decimal_result<char32_t_*>
fmt::v8::detail::format_decimal<char32_t,unsigned_long>(char32_t *out,unsigned_long value,int size)

{
  undefined2 uVar1;
  char32_t *pcVar2;
  int iVar3;
  char32_t *pcVar4;
  undefined1 uVar6;
  undefined1 auVar5 [16];
  format_decimal_result<char32_t_*> fVar7;
  
  iVar3 = do_count_digits(value);
  if (iVar3 <= size) {
    pcVar2 = out + size;
    while (pcVar4 = pcVar2 + -2, 99 < value) {
      uVar1 = *(undefined2 *)
               (
               "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
               + (value % 100) * 2);
      uVar6 = (undefined1)((ushort)uVar1 >> 8);
      auVar5 = ZEXT416(CONCAT22((short)(CONCAT13(uVar6,CONCAT12(uVar6,uVar1)) >> 0x10),
                                CONCAT11((char)uVar1,(char)uVar1)));
      auVar5 = pshuflw(auVar5,auVar5,0x60);
      *(ulong *)pcVar4 = CONCAT44(auVar5._4_4_ >> 0x18,auVar5._0_4_ >> 0x18);
      value = value / 100;
      pcVar2 = pcVar4;
    }
    if (value < 10) {
      pcVar2[-1] = (uint)value | 0x30;
      pcVar4 = pcVar2 + -1;
    }
    else {
      uVar1 = *(undefined2 *)
               (
               "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
               + value * 2);
      uVar6 = (undefined1)((ushort)uVar1 >> 8);
      auVar5 = ZEXT416(CONCAT22((short)(CONCAT13(uVar6,CONCAT12(uVar6,uVar1)) >> 0x10),
                                CONCAT11((char)uVar1,(char)uVar1)));
      auVar5 = pshuflw(auVar5,auVar5,0x60);
      *(ulong *)pcVar4 = CONCAT44(auVar5._4_4_ >> 0x18,auVar5._0_4_ >> 0x18);
    }
    fVar7.end = out + size;
    fVar7.begin = pcVar4;
    return fVar7;
  }
  fmt::v8::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
             ,0x45e,"invalid digit count");
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}